

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void phosg::write_png_chunk<phosg::Image::save[abi:cxx11](phosg::Image::Format)const::__0&>
               (char (*type) [5],void *data,be_uint32_t size,anon_class_8_1_6971b95b *writer)

{
  uint uVar1;
  be_uint32_t crc;
  be_uint32_t size_local;
  
  size_local = size;
  Image::save::anon_class_8_1_6971b95b::operator()(writer,&size_local,4);
  Image::save::anon_class_8_1_6971b95b::operator()(writer,type,4);
  if (size_local.super_reverse_endian<unsigned_int,_unsigned_int>.
      super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
      .value != (converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
                 )0x0) {
    Image::save::anon_class_8_1_6971b95b::operator()
              (writer,data,
               (ulong)((uint)size_local.super_reverse_endian<unsigned_int,_unsigned_int>.
                             super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
                             .value >> 0x18 |
                       ((uint)size_local.super_reverse_endian<unsigned_int,_unsigned_int>.
                              super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
                              .value & 0xff0000) >> 8 |
                       ((uint)size_local.super_reverse_endian<unsigned_int,_unsigned_int>.
                              super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
                              .value & 0xff00) << 8 |
                      (int)size_local.super_reverse_endian<unsigned_int,_unsigned_int>.
                           super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
                           .value << 0x18));
  }
  uVar1 = crc32(0,type,4);
  crc.super_reverse_endian<unsigned_int,_unsigned_int>.
  super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
  .value = (reverse_endian<unsigned_int,_unsigned_int>)
           (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
  if (size_local.super_reverse_endian<unsigned_int,_unsigned_int>.
      super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
      .value != (converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
                 )0x0) {
    uVar1 = crc32(uVar1,data,
                  (uint)size_local.super_reverse_endian<unsigned_int,_unsigned_int>.
                        super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
                        .value >> 0x18 |
                  ((uint)size_local.super_reverse_endian<unsigned_int,_unsigned_int>.
                         super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
                         .value & 0xff0000) >> 8 |
                  ((uint)size_local.super_reverse_endian<unsigned_int,_unsigned_int>.
                         super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
                         .value & 0xff00) << 8 |
                  (int)size_local.super_reverse_endian<unsigned_int,_unsigned_int>.
                       super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
                       .value << 0x18);
    crc.super_reverse_endian<unsigned_int,_unsigned_int>.
    super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
    .value = (reverse_endian<unsigned_int,_unsigned_int>)
             (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
  }
  Image::save::anon_class_8_1_6971b95b::operator()(writer,&crc,4);
  return;
}

Assistant:

static void write_png_chunk(const char (&type)[5],
    const void* data, be_uint32_t size,
    Writer&& writer) {

  writer(&size, 4);
  writer(type, 4);
  if (size > 0) {
    writer(data, size);
  }

  // The CRC includes the chunk type, but not the length
  // The CRC of the (empty) IEND chunk is big-endian 0xAE426082
  be_uint32_t crc = crc32(0u, reinterpret_cast<const Bytef*>(type), 4);
  if (size > 0) {
    crc = crc32(crc, static_cast<const Bytef*>(data), size);
  }
  writer(&crc, 4);
}